

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O0

void __thiscall
slang::DiagnosticEngine::setMappingsFromPragmasImpl<slang::SourceManager::DiagnosticDirectiveInfo>
          (DiagnosticEngine *this,BufferID buffer,
          span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL>
          directives,Diagnostics *diags)

{
  string_view name_00;
  string_view optionName;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  string_view arg;
  reference pvVar1;
  type *ptVar2;
  bool bVar3;
  size_type sVar4;
  reference ppVar5;
  pointer ppVar6;
  unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
  *puVar7;
  pointer ppVar8;
  reference pDVar9;
  long lVar10;
  long in_RDI;
  SourceLocation in_R8;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  span<const_slang::DiagCode,_18446744073709551615UL> sVar12;
  Diagnostic *diag;
  DiagCode code_2;
  iterator __end7;
  iterator __begin7;
  span<const_slang::DiagCode,_18446744073709551615UL> *__range7;
  span<const_slang::DiagCode,_18446744073709551615UL> codes;
  DiagCode code_1;
  iterator __end6;
  iterator __begin6;
  span<const_slang::DiagCode,_18446744073709551615UL> *__range6;
  DiagGroup *group;
  iterator it;
  mapped_type *mappings;
  type *_;
  type *code;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  value_type *prev;
  string_view name;
  DiagnosticDirectiveInfo *directive;
  iterator __end0;
  iterator __begin0;
  span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL> *__range2;
  anon_class_24_3_94aef59f noteDiag;
  vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
  mappingStack;
  size_t hash_2;
  uint n_2;
  value_type *p_2;
  value_type *elements_2;
  int mask_2;
  group_type *pg_2;
  size_t pos_2;
  prober pb_2;
  locator loc;
  size_t pos0;
  size_t hash;
  DiagCode *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  locator loc_1;
  size_t pos0_1;
  size_t hash_1;
  BufferID *k_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL>
  *in_stack_fffffffffffff8c8;
  DiagnosticEngine *in_stack_fffffffffffff8d0;
  SourceLocation in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8e0;
  DiagCode in_stack_fffffffffffff8e4;
  pointer in_stack_fffffffffffff8e8;
  DiagGroup *in_stack_fffffffffffff8f0;
  char *in_stack_fffffffffffff8f8;
  size_t in_stack_fffffffffffff900;
  vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
  *in_stack_fffffffffffff908;
  Diagnostic *in_stack_fffffffffffff910;
  undefined7 in_stack_fffffffffffff918;
  undefined1 in_stack_fffffffffffff91f;
  char_pointer in_stack_fffffffffffff920;
  undefined7 in_stack_fffffffffffff930;
  undefined1 in_stack_fffffffffffff937;
  anon_class_24_3_94aef59f *in_stack_fffffffffffff938;
  type *in_stack_fffffffffffff940;
  raw_key_type *in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff950;
  uint in_stack_fffffffffffff954;
  __normal_iterator<const_slang::DiagCode_*,_std::span<const_slang::DiagCode,_18446744073709551615UL>_>
  local_578;
  pointer *local_570;
  basic_string_view<char,_std::char_traits<char>_> local_568;
  pointer local_558;
  size_t local_550;
  DiagCode local_548;
  DiagCode local_544;
  DiagCode *local_540;
  __normal_iterator<const_slang::DiagCode_*,_std::span<const_slang::DiagCode,_18446744073709551615UL>_>
  local_538;
  span<const_slang::DiagCode,_18446744073709551615UL> local_530;
  span<const_slang::DiagCode,_18446744073709551615UL> *local_520;
  basic_string_view<char,_std::char_traits<char>_> local_518;
  DiagGroup *local_500;
  basic_string_view<char,_std::char_traits<char>_> local_4f8;
  basic_string_view<char,_std::char_traits<char>_> local_4e8;
  iterator local_4d8;
  char_pointer local_4c8;
  table_element_pointer local_4c0;
  vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
  *local_4b8;
  type *local_4b0;
  type *local_4a8;
  pair<const_slang::DiagCode,_slang::DiagnosticSeverity> local_4a0;
  iterator local_498;
  iterator local_488;
  reference local_478;
  reference local_470;
  size_t local_458;
  char *local_450;
  size_t local_438;
  char *local_430;
  basic_string_view<char,_std::char_traits<char>_> local_428;
  reference local_418;
  DiagnosticDirectiveInfo *local_410;
  __normal_iterator<const_slang::SourceManager::DiagnosticDirectiveInfo_*,_std::span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL>_>
  local_408;
  undefined1 *local_400;
  undefined1 *local_3f0;
  vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
  *local_3e8;
  vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
  local_3d0;
  SourceLocation local_3b8;
  undefined1 local_3a8 [20];
  undefined1 local_394 [4];
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_390;
  type *local_378;
  long local_370;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_368;
  undefined1 *local_350;
  unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
  *local_348;
  type *local_340;
  reference local_338;
  char_pointer local_330;
  table_element_pointer local_328;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>
  local_320;
  type *local_308;
  reference local_300;
  iterator local_2f8;
  size_t local_2e8;
  type *local_2e0;
  reference local_2d8;
  uint local_2cc;
  value_type *local_2c8;
  value_type *local_2c0;
  uint local_2b4;
  group_type *local_2b0;
  size_t local_2a8;
  pow2_quadratic_prober local_2a0;
  size_t local_290;
  size_t local_288;
  type *local_280;
  reference local_278;
  undefined1 local_269;
  type *local_268;
  long local_260;
  bool local_251 [25];
  iterator local_238;
  bool local_221 [25];
  iterator local_208;
  bool local_1f1;
  iterator local_1f0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>
  local_1e0;
  size_t local_1c8;
  size_t local_1c0;
  DiagCode *local_1b8;
  type *local_1b0;
  undefined1 *local_1a8;
  long local_1a0;
  uint local_194;
  value_type *local_190;
  value_type *local_188;
  uint local_17c;
  group_type *local_178;
  size_t local_170;
  pow2_quadratic_prober local_168;
  size_t local_158;
  size_t local_150;
  DiagCode *local_148;
  long local_140;
  undefined1 local_131;
  undefined1 *local_130;
  unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
  *local_128;
  bool local_119 [25];
  iterator local_100;
  bool local_e9 [25];
  iterator local_d0;
  bool local_b9;
  iterator local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
  local_a8;
  size_t local_90;
  size_t local_88;
  BufferID *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
  *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  BufferID *local_10;
  unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
  *local_8;
  
  local_3b8 = in_R8;
  std::
  vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
  ::vector((vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
            *)0x533703);
  std::
  vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
  ::emplace_back<>((vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
                    *)in_stack_fffffffffffff8d0);
  local_3f0 = local_394;
  local_3e8 = &local_3d0;
  local_400 = local_3a8;
  local_408._M_current =
       (DiagnosticDirectiveInfo *)
       std::span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL>::begin
                 (in_stack_fffffffffffff8c8);
  local_410 = (DiagnosticDirectiveInfo *)
              std::span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL>
              ::end((span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL>
                     *)in_stack_fffffffffffff8d8);
  bVar11._M_str = in_stack_fffffffffffff8f8;
  bVar11._M_len = in_stack_fffffffffffff900;
  do {
    bVar3 = __gnu_cxx::
            operator==<const_slang::SourceManager::DiagnosticDirectiveInfo_*,_std::span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::SourceManager::DiagnosticDirectiveInfo_*,_std::span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffff8d0,
                       (__normal_iterator<const_slang::SourceManager::DiagnosticDirectiveInfo_*,_std::span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffff8c8);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      std::
      vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
      ::~vector((vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      return;
    }
    local_418 = __gnu_cxx::
                __normal_iterator<const_slang::SourceManager::DiagnosticDirectiveInfo_*,_std::span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL>_>
                ::operator*(&local_408);
    local_438 = (local_418->name)._M_len;
    local_430 = (local_418->name)._M_str;
    local_428._M_len = local_438;
    local_428._M_str = local_430;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
               (char *)in_stack_fffffffffffff8d8);
    __x._M_str = (char *)bVar11._M_len;
    __x._M_len = (size_t)bVar11._M_str;
    __y._M_str = (char *)in_stack_fffffffffffff8f0;
    __y._M_len = (size_t)in_stack_fffffffffffff8e8;
    bVar3 = std::operator==(__x,__y);
    if (bVar3) {
      std::
      vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
      ::back((vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
              *)in_stack_fffffffffffff8d0);
      std::
      vector<boost::unordered::unordered_flat_map<slang::DiagCode,slang::DiagnosticSeverity,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>,std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,slang::DiagnosticSeverity,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>>>
      ::
      emplace_back<boost::unordered::unordered_flat_map<slang::DiagCode,slang::DiagnosticSeverity,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>&>
                ((vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                 (unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                  *)in_stack_fffffffffffff8d8);
    }
    else {
      local_458 = local_428._M_len;
      local_450 = local_428._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                 (char *)in_stack_fffffffffffff8d8);
      __x_00._M_str = (char *)bVar11._M_len;
      __x_00._M_len = (size_t)bVar11._M_str;
      __y_00._M_str = (char *)in_stack_fffffffffffff8f0;
      __y_00._M_len = (size_t)in_stack_fffffffffffff8e8;
      bVar3 = std::operator==(__x_00,__y_00);
      if (bVar3) {
        sVar4 = std::
                vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
                ::size(&local_3d0);
        if (1 < sVar4) {
          sVar4 = std::
                  vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
                  ::size(&local_3d0);
          local_470 = std::
                      vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
                      ::operator[](&local_3d0,sVar4 - 2);
          local_478 = std::
                      vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
                      ::back((vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
                              *)in_stack_fffffffffffff8d0);
          local_488 = boost::unordered::
                      unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                      ::begin((unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                               *)0x533946);
          local_498 = boost::unordered::
                      unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                      ::end((unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                             *)0x533963);
          while( true ) {
            bVar3 = boost::unordered::detail::foa::operator!=
                              ((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                *)in_stack_fffffffffffff8d0,
                               (table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                *)in_stack_fffffffffffff8c8);
            if (!bVar3) break;
            ppVar5 = boost::unordered::detail::foa::
                     table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                     ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                  *)0x5339ae);
            local_4a0 = *ppVar5;
            local_4a8 = std::get<0ul,slang::DiagCode_const,slang::DiagnosticSeverity>
                                  ((pair<const_slang::DiagCode,_slang::DiagnosticSeverity> *)
                                   0x5339ce);
            local_4b0 = std::get<1ul,slang::DiagCode_const,slang::DiagnosticSeverity>
                                  ((pair<const_slang::DiagCode,_slang::DiagnosticSeverity> *)
                                   0x5339e3);
            lVar10 = in_RDI + 0xb0;
            local_378 = local_4a8;
            local_268 = local_4a8;
            local_1a8 = &local_269;
            local_1b0 = local_4a8;
            local_370 = lVar10;
            local_260 = lVar10;
            local_1a0 = lVar10;
            local_1b8 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>_>
                        ::key_from<slang::DiagCode>(local_4a8);
            local_1c0 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>_>
                        ::hash_for<slang::DiagCode>
                                  ((table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>_>
                                    *)in_stack_fffffffffffff8d0,
                                   (DiagCode *)in_stack_fffffffffffff8c8);
            local_1c8 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>_>
                        ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>_>
                                        *)in_stack_fffffffffffff8d0,
                                       (size_t)in_stack_fffffffffffff8c8);
            local_148 = local_1b8;
            local_158 = local_1c0;
            local_150 = local_1c8;
            local_140 = lVar10;
            boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                      (&local_168,local_1c8);
            do {
              local_170 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_168);
              local_178 = boost::unordered::detail::foa::
                          table_arrays<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>_>
                          ::groups((table_arrays<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>_>
                                    *)0x533b6c);
              local_178 = local_178 + local_170;
              local_17c = boost::unordered::detail::foa::
                          group15<boost::unordered::detail::foa::plain_integral>::match
                                    ((group15<boost::unordered::detail::foa::plain_integral> *)
                                     in_stack_fffffffffffff8d8,(size_t)in_stack_fffffffffffff8d0);
              if (local_17c != 0) {
                local_188 = boost::unordered::detail::foa::
                            table_arrays<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>_>
                            ::elements((table_arrays<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>_>
                                        *)0x533bca);
                local_190 = local_188 + local_170 * 0xf;
                do {
                  local_194 = boost::unordered::detail::foa::unchecked_countr_zero(0);
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>_>
                  ::pred((table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>_>
                          *)0x533c1d);
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>
                  ::
                  key_from<std::pair<slang::DiagCode_const,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>
                            ((pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>
                              *)0x533c50);
                  bVar3 = std::equal_to<slang::DiagCode>::operator()
                                    ((equal_to<slang::DiagCode> *)
                                     CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                                     (DiagCode *)in_stack_fffffffffffff8d8,
                                     (DiagCode *)in_stack_fffffffffffff8d0);
                  if (bVar3) {
                    boost::unordered::detail::foa::
                    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>
                    ::table_locator(&local_1e0,local_178,local_194,local_190 + local_194);
                    goto LAB_00533d6c;
                  }
                  local_17c = local_17c - 1 & local_17c;
                } while (local_17c != 0);
              }
              bVar3 = boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                ((group15<boost::unordered::detail::foa::plain_integral> *)
                                 in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
              if (bVar3) {
                memset(&local_1e0,0,0x18);
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>
                ::table_locator(&local_1e0);
                goto LAB_00533d6c;
              }
              bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                (&local_168,*(size_t *)(in_RDI + 0xb8));
            } while (bVar3);
            memset(&local_1e0,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>
            ::table_locator(&local_1e0);
LAB_00533d6c:
            bVar3 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                              ((table_locator *)&local_1e0);
            if (bVar3) {
              local_1f0 = boost::unordered::detail::foa::
                          table<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>_>
                          ::make_iterator((locator *)0x533d8e);
              local_1f1 = false;
              std::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
              ::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                        (&local_390,&local_1f0,&local_1f1);
            }
            else if (*(ulong *)(in_RDI + 0xd8) < *(ulong *)(in_RDI + 0xd0)) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>
              ::
              unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::DiagCode_const&>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>_>
                          *)bVar11._M_len,(size_t)bVar11._M_str,(size_t)in_stack_fffffffffffff8f0,
                         (try_emplace_args_t *)in_stack_fffffffffffff8e8,
                         (DiagCode *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
              local_208 = boost::unordered::detail::foa::
                          table<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>_>
                          ::make_iterator((locator *)0x533e1e);
              local_221[0] = true;
              std::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
              ::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                        (&local_390,&local_208,local_221);
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::DiagCode_const&>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                         (size_t)in_stack_fffffffffffff948,
                         (try_emplace_args_t *)in_stack_fffffffffffff940,
                         (DiagCode *)in_stack_fffffffffffff938);
              local_238 = boost::unordered::detail::foa::
                          table<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>_>
                          ::make_iterator((locator *)0x533e91);
              local_251[0] = true;
              std::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
              ::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                        (&local_390,&local_238,local_251);
            }
            ppVar6 = boost::unordered::detail::foa::
                     table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                     ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                   *)in_stack_fffffffffffff8d0);
            puVar7 = &ppVar6->second;
            local_350 = local_394;
            local_70 = &local_131;
            local_348 = puVar7;
            local_130 = local_350;
            local_128 = puVar7;
            local_78 = local_350;
            local_68 = puVar7;
            local_80 = boost::unordered::detail::foa::
                       table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
                       ::key_from<slang::BufferID>(local_350);
            local_88 = boost::unordered::detail::foa::
                       table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
                       ::hash_for<slang::BufferID>
                                 ((table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
                                   *)in_stack_fffffffffffff8d0,(BufferID *)in_stack_fffffffffffff8c8
                                 );
            local_90 = boost::unordered::detail::foa::
                       table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
                       ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
                                       *)in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8
                                     );
            local_10 = local_80;
            local_20 = local_88;
            local_18 = local_90;
            local_8 = puVar7;
            boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                      (&local_30,local_90);
            do {
              local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
              local_40 = boost::unordered::detail::foa::
                         table_arrays<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
                         ::groups((table_arrays<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
                                   *)0x53405d);
              local_40 = local_40 + local_38;
              local_44 = boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::match
                                   ((group15<boost::unordered::detail::foa::plain_integral> *)
                                    in_stack_fffffffffffff8d8,(size_t)in_stack_fffffffffffff8d0);
              if (local_44 != 0) {
                local_50 = boost::unordered::detail::foa::
                           table_arrays<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
                           ::elements((table_arrays<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
                                       *)0x5340bb);
                local_58 = local_50 + local_38 * 0xf;
                do {
                  local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
                  ::pred((table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
                          *)0x53410e);
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
                  ::
                  key_from<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>
                            ((pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>
                              *)0x534141);
                  bVar3 = std::equal_to<slang::BufferID>::operator()
                                    ((equal_to<slang::BufferID> *)in_stack_fffffffffffff8d0,
                                     (BufferID *)in_stack_fffffffffffff8c8,(BufferID *)0x534168);
                  if (bVar3) {
                    boost::unordered::detail::foa::
                    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                    ::table_locator(&local_a8,local_40,local_5c,local_58 + local_5c);
                    goto LAB_0053425d;
                  }
                  local_44 = local_44 - 1 & local_44;
                } while (local_44 != 0);
              }
              bVar3 = boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                ((group15<boost::unordered::detail::foa::plain_integral> *)
                                 in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
              if (bVar3) {
                memset(&local_a8,0,0x18);
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                ::table_locator(&local_a8);
                goto LAB_0053425d;
              }
              bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                (&local_30,
                                 (ppVar6->second).table_.
                                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                                 .arrays.groups_size_mask);
            } while (bVar3);
            memset(&local_a8,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
            ::table_locator(&local_a8);
LAB_0053425d:
            bVar3 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                              ((table_locator *)&local_a8);
            if (bVar3) {
              local_b8 = boost::unordered::detail::foa::
                         table<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
                         ::make_iterator((locator *)0x53427f);
              local_b9 = false;
              std::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
              ::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                        (&local_368,&local_b8,&local_b9);
            }
            else if ((ppVar6->second).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                     .size_ctrl.size <
                     (ppVar6->second).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                     .size_ctrl.ml) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
              ::
              unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::BufferID_const&>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
                          *)bVar11._M_len,(size_t)bVar11._M_str,(size_t)in_stack_fffffffffffff8f0,
                         (try_emplace_args_t *)in_stack_fffffffffffff8e8,
                         (BufferID *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
              local_d0 = boost::unordered::detail::foa::
                         table<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
                         ::make_iterator((locator *)0x53430f);
              local_e9[0] = true;
              std::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
              ::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                        (&local_368,&local_d0,local_e9);
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::BufferID_const&>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                         (size_t)in_stack_fffffffffffff948,
                         (try_emplace_args_t *)in_stack_fffffffffffff940,
                         (BufferID *)in_stack_fffffffffffff938);
              local_100 = boost::unordered::detail::foa::
                          table<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
                          ::make_iterator((locator *)0x534382);
              local_119[0] = true;
              std::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
              ::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                        (&local_368,&local_100,local_119);
            }
            ppVar8 = boost::unordered::detail::foa::
                     table_iterator<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                     ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                   *)in_stack_fffffffffffff8d0);
            pvVar1 = local_470;
            local_4b8 = &ppVar8->second;
            local_338 = local_470;
            local_340 = local_4a8;
            local_300 = local_470;
            local_308 = local_4a8;
            local_2d8 = local_470;
            local_2e0 = local_4a8;
            local_2e8 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                        ::hash_for<slang::DiagCode>
                                  ((table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                                    *)in_stack_fffffffffffff8d0,
                                   (DiagCode *)in_stack_fffffffffffff8c8);
            ptVar2 = local_2e0;
            local_288 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                        ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                                        *)in_stack_fffffffffffff8d0,
                                       (size_t)in_stack_fffffffffffff8c8);
            local_278 = pvVar1;
            local_280 = ptVar2;
            local_290 = local_2e8;
            boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                      (&local_2a0,local_288);
            do {
              local_2a8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_2a0);
              local_2b0 = boost::unordered::detail::foa::
                          table_arrays<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                          ::groups((table_arrays<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                                    *)0x534531);
              local_2b0 = local_2b0 + local_2a8;
              in_stack_fffffffffffff954 =
                   boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffff8d8,(size_t)in_stack_fffffffffffff8d0);
              local_2b4 = in_stack_fffffffffffff954;
              if (in_stack_fffffffffffff954 != 0) {
                local_2c0 = boost::unordered::detail::foa::
                            table_arrays<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                            ::elements((table_arrays<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                                        *)0x53458f);
                local_2c8 = local_2c0 + local_2a8 * 0xf;
                do {
                  local_2cc = boost::unordered::detail::foa::unchecked_countr_zero(0);
                  in_stack_fffffffffffff938 =
                       (anon_class_24_3_94aef59f *)
                       boost::unordered::detail::foa::
                       table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                       ::pred((table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                               *)0x5345e2);
                  in_stack_fffffffffffff940 = local_280;
                  in_stack_fffffffffffff948 =
                       boost::unordered::detail::foa::
                       table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,slang::DiagnosticSeverity>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>
                       ::key_from<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>
                                 ((pair<const_slang::DiagCode,_slang::DiagnosticSeverity> *)0x53460c
                                 );
                  bVar3 = std::equal_to<slang::DiagCode>::operator()
                                    ((equal_to<slang::DiagCode> *)
                                     CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                                     (DiagCode *)in_stack_fffffffffffff8d8,
                                     (DiagCode *)in_stack_fffffffffffff8d0);
                  if (bVar3) {
                    boost::unordered::detail::foa::
                    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>
                    ::table_locator(&local_320,local_2b0,local_2cc,local_2c8 + local_2cc);
                    goto LAB_0053471c;
                  }
                  local_2b4 = local_2b4 - 1 & local_2b4;
                } while (local_2b4 != 0);
              }
              in_stack_fffffffffffff937 =
                   boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
              if ((bool)in_stack_fffffffffffff937) {
                memset(&local_320,0,0x18);
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>
                ::table_locator(&local_320);
                goto LAB_0053471c;
              }
              bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                (&local_2a0,
                                 (pvVar1->table_).
                                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                                 .arrays.groups_size_mask);
            } while (bVar3);
            memset(&local_320,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>
            ::table_locator(&local_320);
LAB_0053471c:
            local_2f8 = boost::unordered::detail::foa::
                        table<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                        ::make_iterator((locator *)0x534729);
            local_330 = local_2f8.pc_;
            local_328 = local_2f8.p_;
            local_4c8 = local_2f8.pc_;
            local_4c0 = local_2f8.p_;
            in_stack_fffffffffffff920 = local_2f8.pc_;
            local_4d8 = boost::unordered::
                        unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                        ::end((unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                               *)0x53479a);
            in_stack_fffffffffffff91f =
                 boost::unordered::detail::foa::operator!=
                           ((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                             *)in_stack_fffffffffffff8d0,
                            (table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                             *)in_stack_fffffffffffff8c8);
            if ((bool)in_stack_fffffffffffff91f) {
              in_stack_fffffffffffff910 = (Diagnostic *)&local_418->offset;
              in_stack_fffffffffffff908 = local_4b8;
              boost::unordered::detail::foa::
              table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
              ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)0x5347fa);
              std::
              vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>
              ::emplace_back<unsigned_long_const&,slang::DiagnosticSeverity&>
                        ((vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                          *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                         (unsigned_long *)in_stack_fffffffffffff8d8,
                         (DiagnosticSeverity *)in_stack_fffffffffffff8d0);
            }
            else {
              std::
              vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>
              ::emplace_back<unsigned_long_const&,std::nullopt_t_const&>
                        ((vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                          *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                         (unsigned_long *)in_stack_fffffffffffff8d8,
                         (nullopt_t *)in_stack_fffffffffffff8d0);
            }
            boost::unordered::detail::foa::
            table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
            ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffff8d0);
          }
          std::
          vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
          ::pop_back((vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
                      *)0x534859);
        }
      }
      else {
        local_4e8 = sv((char *)in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
        __x_01._M_str = (char *)in_stack_fffffffffffff910;
        __x_01._M_len = (size_t)in_stack_fffffffffffff908;
        bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                          ((basic_string_view<char,_std::char_traits<char>_> *)bVar11._M_len,__x_01)
        ;
        if (bVar3) {
          bVar11 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             ((basic_string_view<char,_std::char_traits<char>_> *)
                              in_stack_fffffffffffff8f0,(size_type)in_stack_fffffffffffff8e8,
                              CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
          local_4f8 = bVar11;
          local_428 = bVar11;
        }
        name_00._M_str._0_4_ = in_stack_fffffffffffff8e0;
        name_00._M_len = (size_t)in_stack_fffffffffffff8d8;
        name_00._M_str._4_4_ = in_stack_fffffffffffff8e4;
        local_518 = local_428;
        in_stack_fffffffffffff8f0 = findDiagGroup(in_stack_fffffffffffff8d0,name_00);
        local_500 = in_stack_fffffffffffff8f0;
        if (in_stack_fffffffffffff8f0 == (DiagGroup *)0x0) {
          optionName._M_str._0_4_ = in_stack_fffffffffffff8e0;
          optionName._M_len = (size_t)in_stack_fffffffffffff8d8;
          optionName._M_str._4_4_ = in_stack_fffffffffffff8e4;
          local_568 = local_428;
          sVar12 = findFromOptionName(in_stack_fffffffffffff8d0,optionName);
          local_550 = (size_t)sVar12._M_extent._M_extent_value;
          in_stack_fffffffffffff8e8 = sVar12._M_ptr;
          in_stack_fffffffffffff8e0 = (undefined4)sVar12._M_extent._M_extent_value;
          in_stack_fffffffffffff8e4 = sVar12._M_extent._M_extent_value._4_4_;
          local_558 = in_stack_fffffffffffff8e8;
          bVar3 = std::span<const_slang::DiagCode,_18446744073709551615UL>::empty
                            ((span<const_slang::DiagCode,_18446744073709551615UL> *)0x534a7d);
          if (bVar3) {
            in_stack_fffffffffffff8d8 = local_3b8;
            SourceLocation::SourceLocation
                      ((SourceLocation *)local_3b8,(BufferID)in_stack_fffffffffffff8e4,
                       (uint64_t)in_stack_fffffffffffff8d0);
            in_stack_fffffffffffff8d0 =
                 (DiagnosticEngine *)
                 Diagnostics::add((Diagnostics *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8e4
                                  ,in_stack_fffffffffffff8d8);
            arg._M_len._7_1_ = in_stack_fffffffffffff91f;
            arg._M_len._0_7_ = in_stack_fffffffffffff918;
            arg._M_str = (char *)in_stack_fffffffffffff920;
            Diagnostic::operator<<(in_stack_fffffffffffff910,arg);
          }
          else {
            local_570 = &local_558;
            local_578._M_current =
                 (DiagCode *)
                 std::span<const_slang::DiagCode,_18446744073709551615UL>::begin
                           ((span<const_slang::DiagCode,_18446744073709551615UL> *)
                            in_stack_fffffffffffff8c8);
            std::span<const_slang::DiagCode,_18446744073709551615UL>::end
                      ((span<const_slang::DiagCode,_18446744073709551615UL> *)
                       in_stack_fffffffffffff8d8);
            while( true ) {
              bVar3 = __gnu_cxx::
                      operator==<const_slang::DiagCode_*,_std::span<const_slang::DiagCode,_18446744073709551615UL>_>
                                ((__normal_iterator<const_slang::DiagCode_*,_std::span<const_slang::DiagCode,_18446744073709551615UL>_>
                                  *)in_stack_fffffffffffff8d0,
                                 (__normal_iterator<const_slang::DiagCode_*,_std::span<const_slang::DiagCode,_18446744073709551615UL>_>
                                  *)in_stack_fffffffffffff8c8);
              if (((bVar3 ^ 0xffU) & 1) == 0) break;
              __gnu_cxx::
              __normal_iterator<const_slang::DiagCode_*,_std::span<const_slang::DiagCode,_18446744073709551615UL>_>
              ::operator*(&local_578);
              setMappingsFromPragmasImpl<slang::SourceManager::DiagnosticDirectiveInfo>(slang::BufferID,std::span<slang::SourceManager::DiagnosticDirectiveInfo_const,18446744073709551615ul>,slang::Diagnostics&)
              ::{lambda(slang::DiagCode,auto:1&)#1}::operator()
                        (in_stack_fffffffffffff938,SUB84((ulong)in_stack_fffffffffffff940 >> 0x20,0)
                         ,(DiagnosticDirectiveInfo *)
                          CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
              __gnu_cxx::
              __normal_iterator<const_slang::DiagCode_*,_std::span<const_slang::DiagCode,_18446744073709551615UL>_>
              ::operator++(&local_578);
            }
          }
        }
        else {
          local_530 = DiagGroup::getDiags((DiagGroup *)0x53495e);
          local_520 = &local_530;
          local_538._M_current =
               (DiagCode *)
               std::span<const_slang::DiagCode,_18446744073709551615UL>::begin
                         ((span<const_slang::DiagCode,_18446744073709551615UL> *)
                          in_stack_fffffffffffff8c8);
          local_540 = (DiagCode *)
                      std::span<const_slang::DiagCode,_18446744073709551615UL>::end
                                ((span<const_slang::DiagCode,_18446744073709551615UL> *)
                                 in_stack_fffffffffffff8d8);
          while( true ) {
            bVar3 = __gnu_cxx::
                    operator==<const_slang::DiagCode_*,_std::span<const_slang::DiagCode,_18446744073709551615UL>_>
                              ((__normal_iterator<const_slang::DiagCode_*,_std::span<const_slang::DiagCode,_18446744073709551615UL>_>
                                *)in_stack_fffffffffffff8d0,
                               (__normal_iterator<const_slang::DiagCode_*,_std::span<const_slang::DiagCode,_18446744073709551615UL>_>
                                *)in_stack_fffffffffffff8c8);
            if (((bVar3 ^ 0xffU) & 1) == 0) break;
            pDVar9 = __gnu_cxx::
                     __normal_iterator<const_slang::DiagCode_*,_std::span<const_slang::DiagCode,_18446744073709551615UL>_>
                     ::operator*(&local_538);
            local_548 = *pDVar9;
            local_544 = local_548;
            setMappingsFromPragmasImpl<slang::SourceManager::DiagnosticDirectiveInfo>(slang::BufferID,std::span<slang::SourceManager::DiagnosticDirectiveInfo_const,18446744073709551615ul>,slang::Diagnostics&)
            ::{lambda(slang::DiagCode,auto:1&)#1}::operator()
                      (in_stack_fffffffffffff938,SUB84((ulong)in_stack_fffffffffffff940 >> 0x20,0),
                       (DiagnosticDirectiveInfo *)
                       CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
            __gnu_cxx::
            __normal_iterator<const_slang::DiagCode_*,_std::span<const_slang::DiagCode,_18446744073709551615UL>_>
            ::operator++(&local_538);
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_slang::SourceManager::DiagnosticDirectiveInfo_*,_std::span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL>_>
    ::operator++(&local_408);
  } while( true );
}

Assistant:

void DiagnosticEngine::setMappingsFromPragmasImpl(BufferID buffer,
                                                  std::span<const TDirective> directives,
                                                  Diagnostics& diags) {

    // Store the state of diagnostics each time the user pushes,
    // and restore the state when they pop.
    std::vector<flat_hash_map<DiagCode, DiagnosticSeverity>> mappingStack;
    mappingStack.emplace_back();

    auto noteDiag = [&](DiagCode code, auto& directive) {
        diagMappings[code][buffer].emplace_back(directive.offset, directive.severity);
        mappingStack.back()[code] = directive.severity;
    };

    for (const SourceManager::DiagnosticDirectiveInfo& directive : directives) {
        auto name = directive.name;
        if (name == "__push__") {
            mappingStack.emplace_back(mappingStack.back());
        }
        else if (name == "__pop__") {
            // If the stack size is 1, push was never called, so just ignore.
            if (mappingStack.size() <= 1)
                continue;

            // Any directives that were set revert to their previous values.
            // If there is no previous value, they go back to the default (unset).
            auto& prev = mappingStack[mappingStack.size() - 2];
            for (auto [code, _] : mappingStack.back()) {
                auto& mappings = diagMappings[code][buffer];
                if (auto it = prev.find(code); it != prev.end())
                    mappings.emplace_back(directive.offset, it->second);
                else
                    mappings.emplace_back(directive.offset, std::nullopt);
            }
            mappingStack.pop_back();
        }
        else {
            if (name.starts_with("-W"sv))
                name = name.substr(2);

            if (auto group = findDiagGroup(name)) {
                for (auto code : group->getDiags())
                    noteDiag(code, directive);
            }
            else if (auto codes = findFromOptionName(name); !codes.empty()) {
                for (auto code : codes)
                    noteDiag(code, directive);
            }
            else {
                auto& diag = diags.add(diag::UnknownWarningOption,
                                       SourceLocation(buffer, directive.offset));
                diag << name;
            }
        }
    }
}